

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSModuleDef * js_init_module_std(JSContext *ctx,char *module_name)

{
  JSModuleDef *m;
  
  m = JS_NewCModule(ctx,module_name,js_std_init);
  if (m == (JSModuleDef *)0x0) {
    m = (JSModuleDef *)0x0;
  }
  else {
    JS_AddModuleExportList(ctx,m,js_std_funcs,0x17);
    JS_AddModuleExport(ctx,m,"in");
    JS_AddModuleExport(ctx,m,"out");
    JS_AddModuleExport(ctx,m,"err");
  }
  return m;
}

Assistant:

JSModuleDef *js_init_module_std(JSContext *ctx, const char *module_name)
{
    JSModuleDef *m;
    m = JS_NewCModule(ctx, module_name, js_std_init);
    if (!m)
        return NULL;
    JS_AddModuleExportList(ctx, m, js_std_funcs, countof(js_std_funcs));
    JS_AddModuleExport(ctx, m, "in");
    JS_AddModuleExport(ctx, m, "out");
    JS_AddModuleExport(ctx, m, "err");
    return m;
}